

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O3

void __thiscall hacd::vector<HACD::Vec3>::recreate(vector<HACD::Vec3> *this,HaU32 capacity)

{
  Vec3 *pVVar1;
  uint uVar2;
  Vec3 *pVVar3;
  long lVar4;
  Vec3 *__src;
  
  if (capacity == 0) {
    __src = this->mData;
    if (this->mSize == 0) {
      pVVar3 = (Vec3 *)0x0;
    }
    else {
      pVVar3 = (Vec3 *)0x0;
      memcpy((void *)0x0,__src,(((ulong)this->mSize * 0xc - 1) / 0xc) * 0xc + 0xc);
    }
  }
  else {
    pVVar3 = (Vec3 *)malloc((ulong)capacity * 0xc);
    if ((pVVar3 == (Vec3 *)0x0) || (__src = this->mData, pVVar3 == __src)) {
      __assert_fail("!capacity || newData && newData != mData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                    ,0x23b,"void hacd::vector<HACD::Vec3>::recreate(HaU32) [T = HACD::Vec3]");
    }
    uVar2 = this->mSize;
    if ((ulong)uVar2 != 0) {
      lVar4 = 0;
      do {
        pVVar1 = (Vec3 *)((long)&pVVar3[1].x + lVar4);
        *(undefined4 *)((long)&pVVar3->z + lVar4) = *(undefined4 *)((long)&__src->z + lVar4);
        *(undefined8 *)((long)&pVVar3->x + lVar4) = *(undefined8 *)((long)&__src->x + lVar4);
        lVar4 = lVar4 + 0xc;
      } while (pVVar1 < pVVar3 + uVar2);
    }
  }
  if (-1 < (int)this->mCapacity) {
    free(__src);
  }
  this->mData = pVVar3;
  this->mCapacity = capacity;
  return;
}

Assistant:

HACD_NOINLINE void vector<T>::recreate(HaU32 capacity)
	{
		T* newData = allocate(capacity);
		HACD_ASSERT(!capacity || newData && newData != mData);

		copy(newData, newData + mSize, mData);
		destroy(mData, mData + mSize);
		if(!isInUserMemory())
			deallocate(mData);

		mData = newData;
		mCapacity = capacity;
	}